

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O0

void cfg_reset_items(config_item *items)

{
  cfg_data_type cVar1;
  config_item *local_20;
  config_item *next_items;
  config_item *pcStack_10;
  uint n;
  config_item *items_local;
  
  pcStack_10 = items;
  if (items != (config_item *)0x0) {
    for (; pcStack_10->key != (char *)0x0; pcStack_10 = pcStack_10 + 1) {
      if ((pcStack_10->list & 1U) == 0) {
        if (pcStack_10->type == cdt_string) {
          if (pcStack_10->_malloc != (void *)0x0) {
            free(pcStack_10->_malloc);
            pcStack_10->_malloc = (void *)0x0;
            *(undefined8 *)pcStack_10->value = 0;
          }
        }
        else if (pcStack_10->type == cdt_object) {
          cfg_reset_items(pcStack_10->subitems);
        }
      }
      else {
        cVar1 = pcStack_10->type;
        if (3 < cVar1 - cdt_bool) {
          if (cVar1 != cdt_string) {
            if (cVar1 == cdt_object) {
              if (((pcStack_10->vcount != 0) && (pcStack_10->subitems != (config_item_t *)0x0)) &&
                 (pcStack_10->subitems_free_cb != (_func_void_config_item_t_ptr_uint *)0x0)) {
                local_20 = pcStack_10->subitems;
                for (next_items._4_4_ = 0; next_items._4_4_ < pcStack_10->vcount;
                    next_items._4_4_ = next_items._4_4_ + 1) {
                  cfg_reset_items(local_20);
                  local_20 = next_items_group(local_20);
                }
                (*pcStack_10->subitems_free_cb)(pcStack_10->subitems,pcStack_10->vcount);
                pcStack_10->subitems = (config_item_t *)0x0;
              }
              pcStack_10->value = (void *)0x0;
            }
            goto LAB_00106d7a;
          }
          if (pcStack_10->value != (void *)0x0) {
            while (pcStack_10->vcount != 0) {
              free(*(void **)((long)pcStack_10->value + (ulong)(pcStack_10->vcount - 1) * 8));
              pcStack_10->vcount = pcStack_10->vcount - 1;
            }
          }
        }
        if (pcStack_10->_malloc != (void *)0x0) {
          free(pcStack_10->_malloc);
          pcStack_10->value = (void *)0x0;
          pcStack_10->_malloc = (void *)0x0;
        }
      }
LAB_00106d7a:
      pcStack_10->vcount = 0;
    }
  }
  return;
}

Assistant:

void cfg_reset_items(config_item *items)
{
    unsigned int n;
    config_item * next_items;
    if (!items)
        return;

    for (; items->key != NULL; items = cfg_next_item(items)){
        if (items->list) {
            switch (items->type) {
            case cdt_string:
                if (items->value) {
                    // Free memory for each string
                    for (; items->vcount > 0; items->vcount--)
                        free(((char **)items->value)[items->vcount -1]);
                }
                // Fall through
            case cdt_bool:
            case cdt_uint16:
            case cdt_int:
            case cdt_double:
                // Free memory for whole array
                if (items->_malloc) {
                    free(items->_malloc);
                    items->_malloc = items->value = NULL;
                }
                break;
            case cdt_object:
                // Recursively reset items in object array.
                if (items->vcount && items->subitems && items->subitems_free_cb) {
                    next_items = items->subitems;
                    for (n = 0; n < items->vcount; n++) {
                        cfg_reset_items(next_items);
                        next_items = next_items_group(next_items);
                    }
                    items->subitems_free_cb(items->subitems, items->vcount);
                    items->subitems = NULL;
                }
                items->value = NULL;
                break;
            default:
                // Should not be here
                break;
            }
        }
        else {
            switch (items->type) {
            case cdt_string:
                // Free memory allocated for string
                if (items->_malloc) {
                    free(items->_malloc);
                    items->_malloc = NULL;
                    *(char **)items->value = NULL;
                }
                break;
            case cdt_object:
                // Recursively reset subitems of object
                cfg_reset_items(items->subitems);
                break;
            default:
                 // No need to free memory
                break;
            }
        }
        items->vcount = 0;
    }
}